

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

ADL_MIDIPlayer * adl_init(long sample_rate)

{
  MIDIplay *this;
  MIDIplay *local_50;
  MIDIplay *player;
  ADL_MIDIPlayer *midi_device;
  long sample_rate_local;
  
  sample_rate_local = (long)malloc(8);
  if ((undefined8 *)sample_rate_local == (undefined8 *)0x0) {
    std::__cxx11::string::operator=
              ((string *)&ADLMIDI_ErrorString_abi_cxx11_,"Can\'t initialize ADLMIDI: out of memory!"
              );
    sample_rate_local = 0;
  }
  else {
    this = (MIDIplay *)operator_new(0x1200,(nothrow_t *)&std::nothrow);
    local_50 = (MIDIplay *)0x0;
    if (this != (MIDIplay *)0x0) {
      MIDIplay::MIDIplay(this,sample_rate);
      local_50 = this;
    }
    if (local_50 == (MIDIplay *)0x0) {
      free((void *)sample_rate_local);
      std::__cxx11::string::operator=
                ((string *)&ADLMIDI_ErrorString_abi_cxx11_,
                 "Can\'t initialize ADLMIDI: out of memory!");
      sample_rate_local = 0;
    }
    else {
      *(MIDIplay **)sample_rate_local = local_50;
      adlCalculateFourOpChannels(local_50,false);
    }
  }
  return (ADL_MIDIPlayer *)sample_rate_local;
}

Assistant:

ADLMIDI_EXPORT struct ADL_MIDIPlayer *adl_init(long sample_rate)
{
    ADL_MIDIPlayer *midi_device;
    midi_device = (ADL_MIDIPlayer *)malloc(sizeof(ADL_MIDIPlayer));
    if(!midi_device)
    {
        ADLMIDI_ErrorString = "Can't initialize ADLMIDI: out of memory!";
        return NULL;
    }

    MIDIplay *player = new(std::nothrow) MIDIplay(static_cast<unsigned long>(sample_rate));
    if(!player)
    {
        free(midi_device);
        ADLMIDI_ErrorString = "Can't initialize ADLMIDI: out of memory!";
        return NULL;
    }
    midi_device->adl_midiPlayer = player;
    adlCalculateFourOpChannels(player);
    return midi_device;
}